

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O1

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  secp256k1_gej *psVar7;
  uint64_t uVar8;
  secp256k1_gej *psVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  secp256k1_ge add;
  secp256k1_scalar gnb;
  secp256k1_ge_storage local_f8;
  secp256k1_ge local_b8;
  secp256k1_scalar local_58;
  
  local_f8.x.n[0] = 0;
  local_f8.x.n[1] = 0;
  local_f8.x.n[2] = 0;
  local_f8.x.n[3] = 0;
  local_f8.y.n[0] = 0;
  local_f8.y.n[1] = 0;
  local_f8.y.n[2] = 0;
  local_f8.y.n[3] = 0;
  psVar7 = &ctx->initial;
  psVar9 = r;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (psVar9->x).n[0] = (psVar7->x).n[0];
    psVar7 = (secp256k1_gej *)((psVar7->x).n + 1);
    psVar9 = (secp256k1_gej *)((psVar9->x).n + 1);
  }
  secp256k1_scalar_add(&local_58,gn,&ctx->blind);
  local_b8.infinity = 0;
  lVar1 = 0x257e08;
  uVar3 = 0;
  uVar4 = local_f8.x.n[0];
  uVar5 = local_f8.y.n[0];
  uVar6 = local_f8.y.n[3];
  uVar8 = local_f8.x.n[1];
  uVar10 = local_f8.x.n[2];
  uVar11 = local_f8.y.n[1];
  uVar12 = local_f8.y.n[2];
  uVar13 = local_f8.x.n[3];
  do {
    uVar2 = 0;
    do {
      if (((uint)(local_58.d[uVar3 >> 4 & 0xfffffff] >> ((char)uVar3 * '\x04' & 0x3fU)) & 0xf) << 6
          == uVar2) {
        uVar4 = *(uint64_t *)(lVar1 + -0x38 + uVar2);
        uVar8 = *(uint64_t *)(lVar1 + -0x30 + uVar2);
        uVar10 = *(uint64_t *)(lVar1 + -0x28 + uVar2);
        uVar13 = *(uint64_t *)(lVar1 + -0x20 + uVar2);
        uVar5 = *(uint64_t *)(lVar1 + -0x18 + uVar2);
        uVar11 = *(uint64_t *)(lVar1 + -0x10 + uVar2);
        uVar12 = *(uint64_t *)(lVar1 + -8 + uVar2);
        uVar6 = *(uint64_t *)(lVar1 + uVar2);
      }
      uVar2 = uVar2 + 0x40;
    } while (uVar2 != 0x400);
    local_f8.x.n[0] = uVar4;
    local_f8.x.n[1] = uVar8;
    local_f8.x.n[2] = uVar10;
    local_f8.x.n[3] = uVar13;
    local_f8.y.n[0] = uVar5;
    local_f8.y.n[1] = uVar11;
    local_f8.y.n[2] = uVar12;
    local_f8.y.n[3] = uVar6;
    secp256k1_ge_from_storage(&local_b8,&local_f8);
    secp256k1_gej_add_ge(r,r,&local_b8);
    uVar3 = uVar3 + 1;
    lVar1 = lVar1 + 0x400;
  } while (uVar3 != 0x40);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    int bits = ECMULT_GEN_PREC_BITS;
    int g = ECMULT_GEN_PREC_G(bits);
    int n = ECMULT_GEN_PREC_N(bits);

    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int i, j, n_i;
    
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (i = 0; i < n; i++) {
        n_i = secp256k1_scalar_get_bits(&gnb, i * bits, bits);
        for (j = 0; j < g; j++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (https://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &secp256k1_ecmult_gen_prec_table[i][j], j == n_i);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    n_i = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}